

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O0

ion_err_t ion_fwrite_at(ion_file_handle_t file,ion_file_offset_t offset,uint num_bytes,
                       ion_byte_t *to_write)

{
  ion_err_t error;
  ion_byte_t *to_write_local;
  uint num_bytes_local;
  ion_file_offset_t offset_local;
  ion_file_handle_t file_local;
  
  file_local._7_1_ = ion_fseek(file,offset,0);
  if (file_local._7_1_ == '\0') {
    file_local._7_1_ = ion_fwrite(file,num_bytes,to_write);
  }
  return file_local._7_1_;
}

Assistant:

ion_err_t
ion_fwrite_at(
	ion_file_handle_t	file,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write
) {
	ion_err_t error;

	error = ion_fseek(file, offset, ION_FILE_START);

	if (err_ok != error) {
		return error;
	}

	error = ion_fwrite(file, num_bytes, to_write);
	return error;
}